

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiddle~.c
# Opt level: O0

void * sigfiddle_new(t_floatarg npoints,t_floatarg npitch,t_floatarg fnpeakanal,t_floatarg fnpeakout
                    )

{
  int iVar1;
  t_symbol *ptVar2;
  _outlet *p_Var3;
  _clock *p_Var4;
  int npeakout;
  int npeakanal;
  int i;
  t_sigfiddle *x;
  t_floatarg fnpeakout_local;
  t_floatarg fnpeakanal_local;
  t_floatarg npitch_local;
  t_floatarg npoints_local;
  
  _npitch_local = (t_sigfiddle *)pd_new(sigfiddle_class);
  iVar1 = sigfiddle_doinit(_npitch_local,(long)npoints,(long)npitch,(long)(int)fnpeakanal,
                           (long)(int)fnpeakout);
  if (iVar1 == 0) {
    _npitch_local->x_inbuf = (t_float *)0x0;
    pd_free((t_pd *)_npitch_local);
    _npitch_local = (t_sigfiddle *)0x0;
  }
  else {
    ptVar2 = gensym("float");
    p_Var3 = outlet_new((t_object *)_npitch_local,ptVar2);
    _npitch_local->x_noteout = p_Var3;
    ptVar2 = gensym("bang");
    p_Var3 = outlet_new((t_object *)_npitch_local,ptVar2);
    _npitch_local->x_attackout = p_Var3;
    for (npeakout = 0; npeakout < _npitch_local->x_npitch; npeakout = npeakout + 1) {
      ptVar2 = gensym("list");
      p_Var3 = outlet_new((t_object *)_npitch_local,ptVar2);
      _npitch_local->x_hist[npeakout].h_outlet = p_Var3;
    }
    ptVar2 = gensym("float");
    p_Var3 = outlet_new((t_object *)_npitch_local,ptVar2);
    _npitch_local->x_envout = p_Var3;
    if (_npitch_local->x_npeakout == 0) {
      _npitch_local->x_peakout = (void *)0x0;
    }
    else {
      ptVar2 = gensym("list");
      p_Var3 = outlet_new((t_object *)_npitch_local,ptVar2);
      _npitch_local->x_peakout = p_Var3;
    }
    p_Var4 = clock_new(_npitch_local,sigfiddle_bang);
    _npitch_local->x_clock = p_Var4;
  }
  return _npitch_local;
}

Assistant:

void *sigfiddle_new(t_floatarg npoints, t_floatarg npitch,
    t_floatarg fnpeakanal, t_floatarg fnpeakout)
{
    t_sigfiddle *x = (t_sigfiddle *)pd_new(sigfiddle_class);
    int i;
    int npeakanal = fnpeakanal, npeakout = fnpeakout;


    if (!sigfiddle_doinit(x, npoints, npitch,
        npeakanal, npeakout))
    {
        x->x_inbuf = 0;     /* prevent the free routine from cleaning up */
        pd_free(&x->x_ob.ob_pd);
        return (0);
    }
    x->x_noteout = outlet_new(&x->x_ob, gensym("float"));
    x->x_attackout = outlet_new(&x->x_ob, gensym("bang"));
    for (i = 0; i < x->x_npitch; i++)
        x->x_hist[i].h_outlet = outlet_new(&x->x_ob, gensym("list"));
    x->x_envout = outlet_new(&x->x_ob, gensym("float"));
    if (x->x_npeakout)
        x->x_peakout = outlet_new(&x->x_ob, gensym("list"));
    else x->x_peakout = 0;
    x->x_clock = clock_new(&x->x_ob.ob_pd, (t_method)sigfiddle_bang);
    return (x);
}